

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_multiple_data_objects.c
# Opt level: O1

int64_t file_seek(archive_conflict *a,void *client_data,int64_t request,wchar_t whence)

{
  int iVar1;
  __off_t _Var2;
  int *piVar3;
  char *fmt;
  
  _Var2 = lseek(*client_data,request,whence);
  if (-1 < _Var2) {
    return _Var2;
  }
  iVar1 = *(int *)((long)client_data + 0x2c);
  piVar3 = __errno_location();
  if (iVar1 == 1) {
    fmt = "Error seeking in \'%s\'";
  }
  else {
    if (iVar1 == 0) {
      archive_set_error((archive *)a,*piVar3,"Error seeking in stdin");
      return -0x1e;
    }
    fmt = "Error seeking in \'%ls\'";
  }
  archive_set_error((archive *)a,*piVar3,fmt,(long)client_data + 0x30);
  return -0x1e;
}

Assistant:

static int64_t
file_seek(struct archive *a, void *data, int64_t request, int whence)
{
  struct mydata *mine = (struct mydata *)data;
  int64_t r;

  (void)a;
  r = lseek(mine->fd, request, whence);
  if (r >= 0)
    return r;
  return (ARCHIVE_FATAL);
}